

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O1

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,deque<Diff,_std::allocator<Diff>_> *list1,
          deque<Diff,_std::allocator<Diff>_> *list2)

{
  _Map_pointer ppDVar1;
  Diff *pDVar2;
  _Map_pointer ppDVar3;
  pointer pwVar4;
  _Elt_pointer pDVar5;
  char cVar6;
  reference pDVar7;
  wstring *pwVar8;
  Diff *d1;
  Diff *pDVar9;
  _Elt_pointer pDVar10;
  bool bVar11;
  _Elt_pointer pDVar12;
  Diff *this_00;
  _Map_pointer ppDVar13;
  ulong __n;
  wstring listString2;
  Diff d2;
  deque<Diff,_std::allocator<Diff>_> *__range2;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [8];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_80;
  deque<Diff,_std::allocator<Diff>_> *local_70;
  _Map_pointer local_68;
  Diff *local_60;
  long *local_58;
  long local_48 [2];
  _Deque_iterator<Diff,_Diff_&,_Diff_*> *local_38;
  
  ppDVar13 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  ppDVar1 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  pDVar2 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  this_00 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_start._M_cur;
  pDVar9 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  ppDVar3 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  local_70 = list1;
  if (((long)pDVar9 - (long)this_00 >> 3) * -0x3333333333333333 +
      ((long)pDVar2 -
       (long)(list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 3) * -0x3333333333333333 +
      (((long)ppDVar13 - (long)ppDVar1 >> 3) + -1 + (ulong)(ppDVar13 == (_Map_pointer)0x0)) * 0xc ==
      ((long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last -
       (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur >> 3) * -0x3333333333333333 +
      ((long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur -
       (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 3) * -0x3333333333333333 +
      (((long)ppDVar3 -
        (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node >> 3) + -1 + (ulong)(ppDVar3 == (_Map_pointer)0x0)) * 0xc) {
    if (this_00 != pDVar2) {
      local_38 = &(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
                  super__Deque_impl_data._M_start;
      bVar11 = false;
      __n = 0;
      local_68 = ppDVar1;
      local_60 = pDVar2;
      do {
        pDVar7 = std::_Deque_iterator<Diff,_Diff_&,_Diff_*>::operator[](local_38,__n);
        local_98._0_4_ = pDVar7->operation;
        pwVar4 = (pDVar7->text)._M_dataplus._M_p;
        local_90._M_p = (pointer)&local_80;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_90,pwVar4,pwVar4 + (pDVar7->text)._M_string_length);
        cVar6 = Diff::operator!=(this_00,(Diff *)local_98);
        if (cVar6 != '\0') {
          bVar11 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p,local_80._M_allocated_capacity * 4 + 4);
        }
        if (cVar6 != '\0') break;
        this_00 = this_00 + 1;
        if (this_00 == pDVar9) {
          this_00 = local_68[1];
          local_68 = local_68 + 1;
          pDVar9 = this_00 + 0xc;
        }
        __n = (ulong)((int)__n + 1);
      } while (this_00 != local_60);
      if (bVar11) goto LAB_0015627c;
    }
    freopen((char *)0x0,"w",_stdout);
    wprintf(L"%ls OK",(strCase->_M_dataplus)._M_p);
    wprintf(L"\n");
    return;
  }
LAB_0015627c:
  local_98 = (undefined1  [8])local_88;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_98,L"(L",L"");
  pDVar10 = (local_70->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pDVar5 = (local_70->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (pDVar10 != pDVar5) {
    pDVar12 = (local_70->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppDVar13 = (local_70->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    bVar11 = true;
    do {
      if (!bVar11) {
        std::__cxx11::wstring::append((wchar_t *)local_98);
      }
      Diff::toString_abi_cxx11_();
      std::__cxx11::wstring::_M_append((wchar_t *)local_98,(ulong)local_b8[0]);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] * 4 + 4);
      }
      pDVar10 = pDVar10 + 1;
      if (pDVar10 == pDVar12) {
        pDVar10 = ppDVar13[1];
        ppDVar13 = ppDVar13 + 1;
        pDVar12 = pDVar10 + 0xc;
      }
      bVar11 = false;
    } while (pDVar10 != pDVar5);
  }
  std::__cxx11::wstring::append((wchar_t *)local_98);
  local_b8[0] = local_a8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_b8,L"(L",L"");
  pDVar10 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_start._M_cur;
  pDVar5 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pDVar10 != pDVar5) {
    pDVar12 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_last;
    ppDVar13 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    bVar11 = true;
    do {
      if (!bVar11) {
        std::__cxx11::wstring::append((wchar_t *)local_b8);
      }
      Diff::toString_abi_cxx11_();
      std::__cxx11::wstring::_M_append((wchar_t *)local_b8,(ulong)local_58);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] * 4 + 4);
      }
      pDVar10 = pDVar10 + 1;
      if (pDVar10 == pDVar12) {
        pDVar10 = ppDVar13[1];
        ppDVar13 = ppDVar13 + 1;
        pDVar12 = pDVar10 + 0xc;
      }
      bVar11 = false;
    } while (pDVar10 != pDVar5);
  }
  std::__cxx11::wstring::append((wchar_t *)local_b8);
  freopen((char *)0x0,"w",_stdout);
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",(strCase->_M_dataplus)._M_p,local_98,local_b8[0]);
  wprintf(L"\n");
  pwVar8 = (wstring *)__cxa_allocate_exception(0x20);
  *(wstring **)pwVar8 = pwVar8 + 0x10;
  pwVar4 = (strCase->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>(pwVar8,pwVar4,pwVar4 + strCase->_M_string_length);
  __cxa_throw(pwVar8,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::deque<Diff> &list1, const std::deque<Diff> &list2) {
  bool fail = false;
  if (list1.size() == list2.size()) {
    int i = 0;
    for (const Diff& d1 : list1) {
      Diff d2 = list2[i];
      if (d1 != d2) {
        fail = true;
        break;
      }
      i++;
    }
  } else {
    fail = true;
  }

  if (fail) {
    // Build human readable description of both lists.
    std::wstring listString1 = L"(L";
    bool first = true;
    for (const Diff& d1 : list1) {
      if (!first) {
        listString1 += L", L";
      }
      listString1 += d1.toString();
      first = false;
    }
    listString1 += L")";
    std::wstring listString2 = L"(L";
    first = true;
    for (const Diff& d2 : list2) {
      if (!first) {
        listString2 += L", L";
      }
      listString2 += d2.toString();
      first = false;
    }
    listString2 += L")";
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
        dmpPrintable(strCase), dmpPrintable(listString1), dmpPrintable(listString2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}